

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldFullName_Test::TestBody
          (DescriptorTest_FieldFullName_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_170;
  Message local_168;
  string_view local_160;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_6;
  Message local_138;
  string_view local_130;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_5;
  Message local_108;
  string_view local_100;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_4;
  Message local_d8;
  string_view local_d0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  Message local_a8;
  string_view local_a0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  string_view local_70;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  string_view local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  DescriptorTest_FieldFullName_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_30 = FieldDescriptor::full_name((this->super_DescriptorTest).foo_);
  testing::internal::EqHelper::
  Compare<char[16],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_20,"\"TestMessage.foo\"","foo_->full_name()",
             (char (*) [16])"TestMessage.foo",&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x459,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_70 = FieldDescriptor::full_name((this->super_DescriptorTest).bar_);
  testing::internal::EqHelper::
  Compare<char[16],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_60,"\"TestMessage.bar\"","bar_->full_name()",
             (char (*) [16])"TestMessage.bar",&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_a0 = FieldDescriptor::full_name((this->super_DescriptorTest).baz_);
  testing::internal::EqHelper::
  Compare<char[16],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_90,"\"TestMessage.baz\"","baz_->full_name()",
             (char (*) [16])"TestMessage.baz",&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_d0 = FieldDescriptor::full_name((this->super_DescriptorTest).moo_);
  testing::internal::EqHelper::
  Compare<char[16],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_c0,"\"TestMessage.moo\"","moo_->full_name()",
             (char (*) [16])"TestMessage.moo",&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_100 = FieldDescriptor::full_name((this->super_DescriptorTest).foo2_);
  testing::internal::EqHelper::
  Compare<char[30],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_f0,"\"corge.grault.TestMessage2.foo\"","foo2_->full_name()",
             (char (*) [30])"corge.grault.TestMessage2.foo",&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_130 = FieldDescriptor::full_name((this->super_DescriptorTest).bar2_);
  testing::internal::EqHelper::
  Compare<char[30],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_120,"\"corge.grault.TestMessage2.bar\"","bar2_->full_name()",
             (char (*) [30])"corge.grault.TestMessage2.bar",&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_160 = FieldDescriptor::full_name((this->super_DescriptorTest).mooo2_);
  testing::internal::EqHelper::
  Compare<char[31],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_150,"\"corge.grault.TestMessage2.mooo\"","mooo2_->full_name()",
             (char (*) [31])"corge.grault.TestMessage2.mooo",&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x460,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldFullName) {
  EXPECT_EQ("TestMessage.foo", foo_->full_name());
  EXPECT_EQ("TestMessage.bar", bar_->full_name());
  EXPECT_EQ("TestMessage.baz", baz_->full_name());
  EXPECT_EQ("TestMessage.moo", moo_->full_name());

  EXPECT_EQ("corge.grault.TestMessage2.foo", foo2_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.bar", bar2_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.mooo", mooo2_->full_name());
}